

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macThread.c
# Opt level: O0

void * generateMAC(void *parameters)

{
  size_t sVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  chunk *pcVar5;
  uint64_t *hash;
  bool bVar6;
  chunk *mac_chunk;
  uint64_t *mac;
  uint64_t mac_progress;
  uint64_t mac_size;
  macParams *params;
  chunk *update_chunk;
  _Bool chunk_maced;
  void *parameters_local;
  
  bVar2 = false;
  params = (macParams *)0x0;
  sVar1 = *(size_t *)(*(long *)((long)parameters + 0x20) + 0x1c0);
  mac = (uint64_t *)0x0;
  while( true ) {
    pcVar5 = front(*(queue **)((long)parameters + 0x38));
    bVar6 = true;
    if (pcVar5 != (chunk *)0x0) {
      pcVar5 = front(*(queue **)((long)parameters + 0x38));
      bVar6 = pcVar5->action != '\x05';
    }
    if (!bVar6) break;
    if ((params == (macParams *)0x0) &&
       (pcVar5 = front(*(queue **)((long)parameters + 0x38)), pcVar5 != (chunk *)0x0)) {
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
      params = (macParams *)front(*(queue **)((long)parameters + 0x38));
      if (params != (macParams *)0x0) {
        deque(*(queue **)((long)parameters + 0x38));
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
      bVar2 = false;
    }
    if (((params != (macParams *)0x0) && (*(char *)&params->mac_status == '\x04')) && (!bVar2)) {
      skeinUpdate(*(SkeinCtx_t **)(*(long *)((long)parameters + 0x20) + 0x1a8),params->running,
                  (size_t)params->valid);
      *(undefined1 *)&params->mac_status =
           *(undefined1 *)(*(long *)((long)parameters + 0x20) + 0x1b0);
      mac = (uint64_t *)(params->valid + (long)mac);
      bVar2 = true;
    }
    if ((params != (macParams *)0x0) && (bVar2)) {
      while (_Var3 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var3) {
        nanosleep((timespec *)&wait_interval,(timespec *)0x0);
      }
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
      _Var3 = enque((chunk *)params,*(queue **)((long)parameters + 0x40));
      if (_Var3) {
        params = (macParams *)0x0;
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
    }
    if ((mac != (uint64_t *)0x0) &&
       (iVar4 = pthread_mutex_trylock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8))
       , iVar4 == 0)) {
      *(long *)(*(long *)((long)parameters + 0x48) + 0x18) =
           (long)mac + *(long *)(*(long *)((long)parameters + 0x48) + 0x18);
      mac = (uint64_t *)0x0;
      pthread_mutex_unlock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8));
    }
  }
  pcVar5 = front(*(queue **)((long)parameters + 0x38));
  if ((pcVar5 == (chunk *)0x0) ||
     (pcVar5 = front(*(queue **)((long)parameters + 0x38)), pcVar5->action != '\x05')) {
    **(undefined4 **)((long)parameters + 0x18) = 0xfffffff5;
  }
  else {
    hash = (uint64_t *)calloc(*(size_t *)(*(long *)((long)parameters + 0x20) + 0x1c0),1);
    skeinFinal(*(SkeinCtx_t **)(*(long *)((long)parameters + 0x20) + 0x1a8),(uint8_t *)hash);
    pcVar5 = createChunk();
    pcVar5->action = '\x06';
    pcVar5->data = hash;
    pcVar5->data_size = sVar1;
    while (_Var3 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var3) {
      nanosleep((timespec *)&wait_interval,(timespec *)0x0);
    }
    pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
    _Var3 = enque(pcVar5,*(queue **)((long)parameters + 0x40));
    if ((!_Var3) &&
       (**(undefined4 **)((long)parameters + 0x18) = 0xfffffff5, hash != (uint64_t *)0x0)) {
      free(hash);
    }
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
    iVar4 = pthread_mutex_trylock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8));
    if (iVar4 == 0) {
      *(size_t *)(*(long *)((long)parameters + 0x48) + 0x18) =
           sVar1 + *(long *)(*(long *)((long)parameters + 0x48) + 0x18);
      pthread_mutex_unlock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8));
    }
    while (_Var3 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var3) {
      nanosleep((timespec *)&wait_interval,(timespec *)0x0);
    }
    pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
    _Var3 = queueDone(*(queue **)((long)parameters + 0x40));
    if (_Var3) {
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
    }
    else {
      **(undefined4 **)((long)parameters + 0x18) = 0xfffffff1;
    }
  }
  return (void *)0x0;
}

Assistant:

void* generateMAC(void* parameters)
{
    pdebug("generateMAC()\n");

    bool chunk_maced = false;
    chunk* update_chunk = NULL;
    macParams* params = parameters;
    const uint64_t mac_size = (uint64_t)params->mac_context->digest_byte_size;
    uint64_t mac_progress = 0;
    
    //iterate through the queue until the DONE flag is received and update the SkeinMAC with everything in it
    while (front(params->in) == NULL || front(params->in)->action != DONE)
    {
        //attempt to get the front chunk in the queue
        if(update_chunk == NULL && front(params->in) != NULL) 
        {
             pthread_mutex_lock(params->in_mutex);
             update_chunk = front(params->in);
             if (update_chunk != NULL) { deque(params->in); }
             pthread_mutex_unlock(params->in_mutex);
             chunk_maced = false;
        }
        
        //generate the MAC from the chunk
        if (update_chunk != NULL && update_chunk->action == GEN_MAC && !chunk_maced)
        {
             pdebug("*** Updating MAC on chunk of size %lu ***\n",
                    update_chunk->data_size);

             //update the MAC with the current chunk
             skeinUpdate(params->mac_context->skein_context_ptr,
                         (const uint8_t*)update_chunk->data,
                         update_chunk->data_size);

             //change the action and status
             update_chunk->action = params->mac_context->out_action;
             mac_progress += update_chunk->data_size; //update the progress bar
             chunk_maced = true;
        }
        
        //attempt to queue the chunk
        if (update_chunk != NULL && chunk_maced)
        {
            pdebug("*** Queuing data chunk to write que of size %lu ***\n",
                   update_chunk->data_size);

            while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); } //spin until queue is empty
            pthread_mutex_lock(params->out_mutex);
            if (enque(update_chunk, params->out)) { update_chunk = NULL; }
            pthread_mutex_unlock(params->out_mutex);
            //on a successfull queue set mac chunk to NULL so the next chunk will be MACed
        } //end queue operation

	    if (mac_progress > 0)
        {
	        if (pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	        {
	            params->progress->progress += mac_progress;
		        mac_progress = 0;
		        pthread_mutex_unlock(params->progress->progress_mutex);
	        }
	    }
        //otherwise spin and wait for the queue to empty
    } //end thread loop

    if (front(params->in) != NULL && front(params->in)->action == DONE)//if we have reached the end of the in queue then get the MAC and que it to the out que 
    {
        uint64_t* mac = calloc(params->mac_context->digest_byte_size,
                               sizeof(uint8_t));

        skeinFinal(params->mac_context->skein_context_ptr, (uint8_t*)mac);
        chunk* mac_chunk = createChunk();
        mac_chunk->action = MAC;
        mac_chunk->data = mac;
        mac_chunk->data_size = mac_size;

        while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); } //wait for the queue to be not be full
        pthread_mutex_lock(params->out_mutex);
        if (!enque(mac_chunk, params->out)) //que the mac chunk 
        {
            *(params->error) = MAC_GENERATION_FAIL; //mac failed to enque
            if (mac != NULL) { free(mac); }
        }
        pthread_mutex_unlock(params->out_mutex);
        pdebug("*** Queuing MAC chunk to write que of size %lu ***\n", mac_size);

        //update the progress bar
	    if (pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	    {
	        params->progress->progress += mac_size;
            mac_progress = 0;
            pthread_mutex_unlock(params->progress->progress_mutex);
	    }

        //queue Done flag
        while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); }
        pthread_mutex_lock(params->out_mutex);
        if (!queueDone(params->out))
        {
            pdebug("Error queueing done\n");
            *(params->error) = QUEUE_OPERATION_FAIL;

            return NULL;
        }

        pthread_mutex_unlock(params->out_mutex);
        pdebug("*** Done queued *** \n");
    }
    else //something went wrong
    {
        *(params->error) = MAC_GENERATION_FAIL;

        return NULL;
    }
    
    return NULL;
}